

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void hexFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  byte bVar1;
  Mem **ppMVar2;
  int iVar3;
  sqlite3_context *pCtx;
  uchar c;
  char *z;
  char *zHex;
  uchar *pBlob;
  int n;
  int i;
  _func_void_void_ptr *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc4;
  sqlite3_value *in_stack_ffffffffffffffc8;
  sqlite3_context *z_00;
  sqlite3_context *in_stack_ffffffffffffffd0;
  byte *local_28;
  int local_1c;
  
  local_28 = (byte *)sqlite3_value_blob(in_stack_ffffffffffffffc8);
  iVar3 = sqlite3_value_bytes((sqlite3_value *)0x1dc341);
  pCtx = (sqlite3_context *)contextMalloc(in_stack_ffffffffffffffd0,(i64)in_stack_ffffffffffffffc8);
  if (pCtx != (sqlite3_context *)0x0) {
    z_00 = pCtx;
    for (local_1c = 0; local_1c < iVar3; local_1c = local_1c + 1) {
      bVar1 = *local_28;
      in_stack_ffffffffffffffc4 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffc4);
      ppMVar2 = &z_00->pOut;
      *(char *)&z_00->pOut = "0123456789ABCDEF"[(int)(uint)bVar1 >> 4];
      z_00 = (sqlite3_context *)((long)&z_00->pOut + 2);
      *(char *)((long)ppMVar2 + 1) = "0123456789ABCDEF"[(int)(bVar1 & 0xf)];
      local_28 = local_28 + 1;
    }
    *(undefined1 *)&z_00->pOut = 0;
    sqlite3_result_text(pCtx,(char *)z_00,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

static void hexFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int i, n;
  const unsigned char *pBlob;
  char *zHex, *z;
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  pBlob = sqlite3_value_blob(argv[0]);
  n = sqlite3_value_bytes(argv[0]);
  assert( pBlob==sqlite3_value_blob(argv[0]) );  /* No encoding change */
  z = zHex = contextMalloc(context, ((i64)n)*2 + 1);
  if( zHex ){
    for(i=0; i<n; i++, pBlob++){
      unsigned char c = *pBlob;
      *(z++) = hexdigits[(c>>4)&0xf];
      *(z++) = hexdigits[c&0xf];
    }
    *z = 0;
    sqlite3_result_text(context, zHex, n*2, sqlite3_free);
  }
}